

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varintdecode.c
# Opt level: O1

size_t altmasked_vbyte_read_loop(uint8_t *in,uint32_t *out,int len_signed)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  ulong uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  size_t sVar6;
  ulong uVar7;
  ulong mask;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint32_t *out_00;
  uint64_t ints_read;
  uint64_t local_58;
  uint8_t *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  uVar11 = (ulong)len_signed;
  if ((uint)len_signed < 0x61) {
    uVar10 = 0;
    mask = 0;
    uVar7 = 0;
    sVar6 = 0;
  }
  else {
    auVar2 = *(undefined1 (*) [32])in;
    auVar1 = *(undefined1 (*) [16])(in + 0x20);
    lVar9 = 0x30;
    mask = 0;
    uVar7 = 0;
    sVar6 = 0;
    uVar3 = (ulong)CONCAT24((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar1[0xf] >> 7) << 0xf,
                            (uint)(SUB321(auVar2 >> 7,0) & 1) |
                            (uint)(SUB321(auVar2 >> 0xf,0) & 1) << 1 |
                            (uint)(SUB321(auVar2 >> 0x17,0) & 1) << 2 |
                            (uint)(SUB321(auVar2 >> 0x1f,0) & 1) << 3 |
                            (uint)(SUB321(auVar2 >> 0x27,0) & 1) << 4 |
                            (uint)(SUB321(auVar2 >> 0x2f,0) & 1) << 5 |
                            (uint)(SUB321(auVar2 >> 0x37,0) & 1) << 6 |
                            (uint)(SUB321(auVar2 >> 0x3f,0) & 1) << 7 |
                            (uint)(SUB321(auVar2 >> 0x47,0) & 1) << 8 |
                            (uint)(SUB321(auVar2 >> 0x4f,0) & 1) << 9 |
                            (uint)(SUB321(auVar2 >> 0x57,0) & 1) << 10 |
                            (uint)(SUB321(auVar2 >> 0x5f,0) & 1) << 0xb |
                            (uint)(SUB321(auVar2 >> 0x67,0) & 1) << 0xc |
                            (uint)(SUB321(auVar2 >> 0x6f,0) & 1) << 0xd |
                            (uint)(SUB321(auVar2 >> 0x77,0) & 1) << 0xe |
                            (uint)SUB321(auVar2 >> 0x7f,0) << 0xf |
                            (uint)(SUB321(auVar2 >> 0x87,0) & 1) << 0x10 |
                            (uint)(SUB321(auVar2 >> 0x8f,0) & 1) << 0x11 |
                            (uint)(SUB321(auVar2 >> 0x97,0) & 1) << 0x12 |
                            (uint)(SUB321(auVar2 >> 0x9f,0) & 1) << 0x13 |
                            (uint)(SUB321(auVar2 >> 0xa7,0) & 1) << 0x14 |
                            (uint)(SUB321(auVar2 >> 0xaf,0) & 1) << 0x15 |
                            (uint)(SUB321(auVar2 >> 0xb7,0) & 1) << 0x16 |
                            (uint)SUB321(auVar2 >> 0xbf,0) << 0x17 |
                            (uint)(SUB321(auVar2 >> 199,0) & 1) << 0x18 |
                            (uint)(SUB321(auVar2 >> 0xcf,0) & 1) << 0x19 |
                            (uint)(SUB321(auVar2 >> 0xd7,0) & 1) << 0x1a |
                            (uint)(SUB321(auVar2 >> 0xdf,0) & 1) << 0x1b |
                            (uint)(SUB321(auVar2 >> 0xe7,0) & 1) << 0x1c |
                            (uint)(SUB321(auVar2 >> 0xef,0) & 1) << 0x1d |
                            (uint)(SUB321(auVar2 >> 0xf7,0) & 1) << 0x1e |
                            (uint)(byte)(auVar2[0x1f] >> 7) << 0x1f);
    local_50 = in;
    local_48 = uVar11;
    do {
      local_40 = uVar7 + 0x60;
      if (local_48 <= local_40) {
        uVar8 = (int)lVar9 - (int)sVar6;
        uVar10 = (ulong)uVar8;
        mask = mask | uVar3 << ((ulong)(uVar8 - 0x30) & 0x3f);
        goto LAB_0013d715;
      }
      auVar2 = *(undefined1 (*) [32])(local_50 + lVar9);
      auVar1 = *(undefined1 (*) [16])(local_50 + lVar9 + 0x20);
      local_38 = (ulong)CONCAT24((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                                 (ushort)(byte)(auVar1[0xf] >> 7) << 0xf,
                                 (uint)(SUB321(auVar2 >> 7,0) & 1) |
                                 (uint)(SUB321(auVar2 >> 0xf,0) & 1) << 1 |
                                 (uint)(SUB321(auVar2 >> 0x17,0) & 1) << 2 |
                                 (uint)(SUB321(auVar2 >> 0x1f,0) & 1) << 3 |
                                 (uint)(SUB321(auVar2 >> 0x27,0) & 1) << 4 |
                                 (uint)(SUB321(auVar2 >> 0x2f,0) & 1) << 5 |
                                 (uint)(SUB321(auVar2 >> 0x37,0) & 1) << 6 |
                                 (uint)(SUB321(auVar2 >> 0x3f,0) & 1) << 7 |
                                 (uint)(SUB321(auVar2 >> 0x47,0) & 1) << 8 |
                                 (uint)(SUB321(auVar2 >> 0x4f,0) & 1) << 9 |
                                 (uint)(SUB321(auVar2 >> 0x57,0) & 1) << 10 |
                                 (uint)(SUB321(auVar2 >> 0x5f,0) & 1) << 0xb |
                                 (uint)(SUB321(auVar2 >> 0x67,0) & 1) << 0xc |
                                 (uint)(SUB321(auVar2 >> 0x6f,0) & 1) << 0xd |
                                 (uint)(SUB321(auVar2 >> 0x77,0) & 1) << 0xe |
                                 (uint)SUB321(auVar2 >> 0x7f,0) << 0xf |
                                 (uint)(SUB321(auVar2 >> 0x87,0) & 1) << 0x10 |
                                 (uint)(SUB321(auVar2 >> 0x8f,0) & 1) << 0x11 |
                                 (uint)(SUB321(auVar2 >> 0x97,0) & 1) << 0x12 |
                                 (uint)(SUB321(auVar2 >> 0x9f,0) & 1) << 0x13 |
                                 (uint)(SUB321(auVar2 >> 0xa7,0) & 1) << 0x14 |
                                 (uint)(SUB321(auVar2 >> 0xaf,0) & 1) << 0x15 |
                                 (uint)(SUB321(auVar2 >> 0xb7,0) & 1) << 0x16 |
                                 (uint)SUB321(auVar2 >> 0xbf,0) << 0x17 |
                                 (uint)(SUB321(auVar2 >> 199,0) & 1) << 0x18 |
                                 (uint)(SUB321(auVar2 >> 0xcf,0) & 1) << 0x19 |
                                 (uint)(SUB321(auVar2 >> 0xd7,0) & 1) << 0x1a |
                                 (uint)(SUB321(auVar2 >> 0xdf,0) & 1) << 0x1b |
                                 (uint)(SUB321(auVar2 >> 0xe7,0) & 1) << 0x1c |
                                 (uint)(SUB321(auVar2 >> 0xef,0) & 1) << 0x1d |
                                 (uint)(SUB321(auVar2 >> 0xf7,0) & 1) << 0x1e |
                                 (uint)(byte)(auVar2[0x1f] >> 7) << 0x1f);
      mask = mask | uVar3 << ((ulong)(byte)(((char)lVar9 - (char)sVar6) - 0x30) & 0x3f);
      uVar11 = lVar9 - 0x10;
      lVar9 = lVar9 + 0x30;
      do {
        uVar10 = sVar6;
        sVar6 = uVar10;
        if (uVar11 <= uVar10) break;
        uVar4 = masked_vbyte_read_group(local_50 + uVar10,out + uVar7,mask,&local_58);
        mask = mask >> (uVar4 & 0x3f);
        uVar5 = local_58;
        if (mask == 0xffffffffffffffff) {
          uVar4 = 0;
          uVar5 = 0;
        }
        uVar7 = uVar7 + uVar5;
        sVar6 = uVar4 + uVar10;
      } while (mask != 0xffffffffffffffff);
      uVar3 = local_38;
    } while (uVar11 <= uVar10);
    uVar10 = 0;
LAB_0013d715:
    uVar11 = local_48;
    in = local_50;
    if (local_40 < local_48) {
      return 0;
    }
  }
  do {
    uVar8 = (uint)uVar10;
    if ((int)uVar8 < 0x10) {
      lVar9 = (long)(int)uVar8;
      if (uVar7 + 0x1f + lVar9 < uVar11) {
        auVar2 = *(undefined1 (*) [32])(in + sVar6 + lVar9);
        mask = mask | (ulong)((uint)(SUB321(auVar2 >> 7,0) & 1) |
                              (uint)(SUB321(auVar2 >> 0xf,0) & 1) << 1 |
                              (uint)(SUB321(auVar2 >> 0x17,0) & 1) << 2 |
                              (uint)(SUB321(auVar2 >> 0x1f,0) & 1) << 3 |
                              (uint)(SUB321(auVar2 >> 0x27,0) & 1) << 4 |
                              (uint)(SUB321(auVar2 >> 0x2f,0) & 1) << 5 |
                              (uint)(SUB321(auVar2 >> 0x37,0) & 1) << 6 |
                              (uint)(SUB321(auVar2 >> 0x3f,0) & 1) << 7 |
                              (uint)(SUB321(auVar2 >> 0x47,0) & 1) << 8 |
                              (uint)(SUB321(auVar2 >> 0x4f,0) & 1) << 9 |
                              (uint)(SUB321(auVar2 >> 0x57,0) & 1) << 10 |
                              (uint)(SUB321(auVar2 >> 0x5f,0) & 1) << 0xb |
                              (uint)(SUB321(auVar2 >> 0x67,0) & 1) << 0xc |
                              (uint)(SUB321(auVar2 >> 0x6f,0) & 1) << 0xd |
                              (uint)(SUB321(auVar2 >> 0x77,0) & 1) << 0xe |
                              (uint)SUB321(auVar2 >> 0x7f,0) << 0xf |
                              (uint)(SUB321(auVar2 >> 0x87,0) & 1) << 0x10 |
                              (uint)(SUB321(auVar2 >> 0x8f,0) & 1) << 0x11 |
                              (uint)(SUB321(auVar2 >> 0x97,0) & 1) << 0x12 |
                              (uint)(SUB321(auVar2 >> 0x9f,0) & 1) << 0x13 |
                              (uint)(SUB321(auVar2 >> 0xa7,0) & 1) << 0x14 |
                              (uint)(SUB321(auVar2 >> 0xaf,0) & 1) << 0x15 |
                              (uint)(SUB321(auVar2 >> 0xb7,0) & 1) << 0x16 |
                              (uint)SUB321(auVar2 >> 0xbf,0) << 0x17 |
                              (uint)(SUB321(auVar2 >> 199,0) & 1) << 0x18 |
                              (uint)(SUB321(auVar2 >> 0xcf,0) & 1) << 0x19 |
                              (uint)(SUB321(auVar2 >> 0xd7,0) & 1) << 0x1a |
                              (uint)(SUB321(auVar2 >> 0xdf,0) & 1) << 0x1b |
                              (uint)(SUB321(auVar2 >> 0xe7,0) & 1) << 0x1c |
                              (uint)(SUB321(auVar2 >> 0xef,0) & 1) << 0x1d |
                              (uint)(SUB321(auVar2 >> 0xf7,0) & 1) << 0x1e |
                             (uint)(byte)(auVar2[0x1f] >> 7) << 0x1f) << (uVar10 & 0x3f);
        uVar8 = uVar8 + 0x20;
      }
      else {
        if (uVar11 <= uVar7 + lVar9 + 0xf) {
          lVar9 = uVar11 - uVar7;
          if (uVar7 <= uVar11 && lVar9 != 0) {
            out_00 = out + uVar7;
            do {
              uVar8 = read_int(in + sVar6,out_00);
              sVar6 = sVar6 + uVar8;
              out_00 = out_00 + 1;
              lVar9 = lVar9 + -1;
            } while (lVar9 != 0);
          }
          return sVar6;
        }
        auVar1 = vlddqu_avx(*(undefined1 (*) [16])(in + sVar6 + lVar9));
        mask = mask | (long)(int)((uint)(ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                                                 (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                                                 (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                                                 (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                                                 (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                                                 (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                                                 (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                                                 (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                                                 (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                                                 (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                                                 (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                                                 (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                                                 (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                                                 (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                                                 (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                                                (ushort)(byte)(auVar1[0xf] >> 7) << 0xf) <<
                                 (uVar8 & 0x1f));
        uVar8 = uVar8 + 0x10;
      }
    }
    uVar5 = masked_vbyte_read_group(in + sVar6,out + uVar7,mask,&local_58);
    sVar6 = sVar6 + uVar5;
    uVar10 = (ulong)(uVar8 - (int)uVar5);
    mask = mask >> (uVar5 & 0x3f);
    uVar7 = uVar7 + local_58;
  } while( true );
}

Assistant:

size_t altmasked_vbyte_read_loop(const uint8_t *in, uint32_t *out,
                                 int len_signed) {
  uint64_t length = (uint64_t)len_signed; // number of ints we want to decode
  size_t consumed = 0;                    // number of bytes read
  uint64_t count = 0; // how many integers we have read so far

  uint64_t sig = 0;
  int availablebytes = 0;
  if (96 < length) {
    size_t scanned = 0;

#ifdef __AVX2__
    __m256i low = _mm256_loadu_si256((__m256i *)(in + scanned));
    uint32_t lowSig = _mm256_movemask_epi8(low);
#else
    __m128i low1 = _mm_loadu_si128((__m128i *)(in + scanned));
    uint32_t lowSig1 = _mm_movemask_epi8(low1);
    __m128i low2 = _mm_loadu_si128((__m128i *)(in + scanned + 16));
    uint32_t lowSig2 = _mm_movemask_epi8(low2);
    uint32_t lowSig = lowSig2 << 16;
    lowSig |= lowSig1;
#endif

    // excess verbosity to avoid problems with sign extension on conversions
    // better to think about what's happening and make it clearer
    __m128i high = _mm_loadu_si128((__m128i *)(in + scanned + 32));
    uint32_t highSig = _mm_movemask_epi8(high);
    uint64_t nextSig = highSig;
    nextSig <<= 32;
    nextSig |= lowSig;
    scanned += 48;

    while (count + 96 < length) { // 96 == 48 + 48 ahead for scanning
      uint64_t thisSig = nextSig;

#ifdef __AVX2__
      low = _mm256_loadu_si256((__m256i *)(in + scanned));
      lowSig = _mm256_movemask_epi8(low);
#else
      low1 = _mm_loadu_si128((__m128i *)(in + scanned));
      lowSig1 = _mm_movemask_epi8(low1);
      low2 = _mm_loadu_si128((__m128i *)(in + scanned + 16));
      lowSig2 = _mm_movemask_epi8(low2);
      lowSig = lowSig2 << 16;
      lowSig |= lowSig1;
#endif

      high = _mm_loadu_si128((__m128i *)(in + scanned + 32));
      highSig = _mm_movemask_epi8(high);
      nextSig = highSig;
      nextSig <<= 32;
      nextSig |= lowSig;

      uint64_t remaining = scanned - (consumed + 48);
      sig = (thisSig << remaining) | sig;

      uint64_t reload = scanned - 16;
      scanned += 48;

      // need to reload when less than 16 scanned bytes remain in sig
      while (consumed < reload) {
        uint64_t ints_read;
        uint64_t bytes = masked_vbyte_read_group(in + consumed, out + count,
                                                 sig, &ints_read);
        sig >>= bytes;

        // seems like this might force the compiler to prioritize shifting sig
        // >>= bytes
        if (sig == 0xFFFFFFFFFFFFFFFF)
          return 0; // fake check to force earliest evaluation

        consumed += bytes;
        count += ints_read;
      }
    }
    sig = (nextSig << (scanned - consumed - 48)) | sig;
    availablebytes = (int)(scanned - consumed);
  }
  while (1) {
    if (availablebytes < 16) {
      if (availablebytes + count + 31 < length) {
#ifdef __AVX2__
        uint64_t newsigavx = (uint32_t)_mm256_movemask_epi8(
            _mm256_loadu_si256((__m256i *)(in + availablebytes + consumed)));
        sig |= (newsigavx << availablebytes);
#else
        uint64_t newsig = _mm_movemask_epi8(
            _mm_lddqu_si128((const __m128i *)(in + availablebytes + consumed)));
        uint64_t newsig2 = _mm_movemask_epi8(_mm_lddqu_si128(
            (const __m128i *)(in + availablebytes + 16 + consumed)));
        sig |= (newsig << availablebytes) | (newsig2 << (availablebytes + 16));
#endif
        availablebytes += 32;
      } else if (availablebytes + count + 15 < length) {
        int newsig = _mm_movemask_epi8(
            _mm_lddqu_si128((const __m128i *)(in + availablebytes + consumed)));
        sig |= newsig << availablebytes;
        availablebytes += 16;
      } else {
        break;
      }
    }
    uint64_t ints_read;

    uint64_t eaten =
        masked_vbyte_read_group(in + consumed, out + count, sig, &ints_read);
    consumed += eaten;
    availablebytes -= eaten;
    sig >>= eaten;
    count += ints_read;
  }
  for (; count < length; count++) {
    consumed += read_int(in + consumed, out + count);
  }
  return consumed;
}